

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsavefile.cpp
# Opt level: O2

void __thiscall QSaveFilePrivate::~QSaveFilePrivate(QSaveFilePrivate *this)

{
  (this->super_QFileDevicePrivate).super_QIODevicePrivate.super_QObjectPrivate.super_QObjectData.
  _vptr_QObjectData = (_func_int **)&PTR__QSaveFilePrivate_006620b8;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->finalFileName).d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->fileName).d);
  QFileDevicePrivate::~QFileDevicePrivate(&this->super_QFileDevicePrivate);
  return;
}

Assistant:

QSaveFilePrivate::~QSaveFilePrivate()
{
}